

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_playlist.cpp
# Opt level: O0

void __thiscall FPlayList::Shuffle(FPlayList *this)

{
  uint uVar1;
  uint uVar2;
  FString *a;
  FString *b;
  uint local_18;
  uint i;
  uint numsongs;
  FPlayList *this_local;
  
  uVar1 = TArray<FString,_FString>::Size(&this->Songs);
  for (local_18 = 0; local_18 < uVar1; local_18 = local_18 + 1) {
    a = TArray<FString,_FString>::operator[](&this->Songs,(ulong)local_18);
    uVar2 = rand();
    b = TArray<FString,_FString>::operator[]
                  (&this->Songs,(ulong)(uVar2 % (uVar1 - local_18) + local_18));
    swapvalues<FString>(a,b);
  }
  this->Position = 0;
  return;
}

Assistant:

void FPlayList::Shuffle ()
{
	unsigned int numsongs = Songs.Size();
	unsigned int i;

	for (i = 0; i < numsongs; ++i)
	{
		swapvalues (Songs[i], Songs[(rand() % (numsongs - i)) + i]);
	}
	Position = 0;
}